

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O0

MPP_RET mpp_packet_copy_init(MppPacket *packet,MppPacket src)

{
  MPP_RET MVar1;
  size_t __n;
  void *__dest;
  MppPacketImpl *p;
  void *pos;
  size_t length;
  void *pvStack_30;
  MPP_RET ret;
  MppPacket pkt;
  MppPacketImpl *src_impl;
  MppPacket src_local;
  MppPacket *packet_local;
  
  src_impl = (MppPacketImpl *)src;
  src_local = packet;
  if ((packet == (MppPacket *)0x0) ||
     (MVar1 = check_is_mpp_packet_f(src,"mpp_packet_copy_init"), MVar1 != MPP_OK)) {
    _mpp_log_l(2,"mpp_packet","found invalid input %p %p\n","mpp_packet_copy_init",src_local,
               src_impl);
    packet_local._4_4_ = MPP_ERR_UNKNOW;
  }
  else {
    *(undefined8 *)src_local = 0;
    pkt = src_impl;
    packet_local._4_4_ = mpp_packet_new(&stack0xffffffffffffffd0);
    if (packet_local._4_4_ == MPP_OK) {
      memcpy(pvStack_30,pkt,0x148);
      if (*(long *)((long)pkt + 0x48) != 0) {
        mpp_meta_inc_ref(*(MppMeta *)((long)pkt + 0x48));
      }
      if (*(long *)((long)pkt + 0x40) == 0) {
        __n = mpp_packet_get_length(src_impl);
        __dest = mpp_osal_malloc("mpp_packet_copy_init",__n + 0x100);
        if (__dest == (void *)0x0) {
          _mpp_log_l(2,"mpp_packet","malloc failed, size %d\n","mpp_packet_copy_init",__n);
          mpp_packet_deinit(&stack0xffffffffffffffd0);
          return MPP_ERR_MALLOC;
        }
        *(void **)((long)pvStack_30 + 0x10) = __dest;
        *(void **)((long)pvStack_30 + 8) = __dest;
        *(size_t *)((long)pvStack_30 + 0x20) = __n;
        *(size_t *)((long)pvStack_30 + 0x18) = __n;
        *(uint *)((long)pvStack_30 + 0x3c) = *(uint *)((long)pvStack_30 + 0x3c) | 4;
        if (__n != 0) {
          memcpy(__dest,*(void **)((long)pkt + 0x10),__n);
          memset((void *)((long)__dest + __n),0,0x100);
        }
      }
      else {
        mpp_buffer_inc_ref_with_caller(*(MppBuffer *)((long)pkt + 0x40),"mpp_packet_copy_init");
      }
      *(void **)src_local = pvStack_30;
      packet_local._4_4_ = MPP_OK;
    }
  }
  return packet_local._4_4_;
}

Assistant:

MPP_RET mpp_packet_copy_init(MppPacket *packet, const MppPacket src)
{
    if (NULL == packet || check_is_mpp_packet(src)) {
        mpp_err_f("found invalid input %p %p\n", packet, src);
        return MPP_ERR_UNKNOW;
    }

    *packet = NULL;

    MppPacketImpl *src_impl = (MppPacketImpl *)src;
    MppPacket pkt;
    MPP_RET ret = mpp_packet_new(&pkt);
    if (ret)
        return ret;

    /* copy the source data */
    memcpy(pkt, src_impl, sizeof(*src_impl));

    /* increase reference of meta data */
    if (src_impl->meta)
        mpp_meta_inc_ref(src_impl->meta);

    if (src_impl->buffer) {
        /* if source packet has buffer just create a new reference to buffer */
        mpp_buffer_inc_ref(src_impl->buffer);
    } else {
        /*
         * NOTE: only copy valid data
         */
        size_t length = mpp_packet_get_length(src);
        /*
         * due to parser may be read 32 bit interface so we must alloc more size
         * then real size to avoid read carsh
         */
        void *pos = mpp_malloc_size(void, length + 256);
        if (NULL == pos) {
            mpp_err_f("malloc failed, size %d\n", length);
            mpp_packet_deinit(&pkt);
            return MPP_ERR_MALLOC;
        }

        MppPacketImpl *p = (MppPacketImpl *)pkt;
        p->data = p->pos = pos;
        p->size = p->length = length;
        p->flag |= MPP_PACKET_FLAG_INTERNAL;

        if (length) {
            memcpy(pos, src_impl->pos, length);
            /*
             * clean more alloc byte to zero
             */
            memset((RK_U8*)pos + length, 0, 256);
        }
    }

    *packet = pkt;
    return MPP_OK;
}